

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_15uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  byte *pbVar22;
  
  for (uVar21 = 0; uVar21 < (length & 0xfffffffffffffff8); uVar21 = uVar21 + 8) {
    bVar1 = pSrc[1];
    bVar2 = pSrc[2];
    bVar3 = pSrc[3];
    bVar4 = pSrc[4];
    bVar5 = pSrc[5];
    bVar6 = pSrc[6];
    bVar7 = pSrc[7];
    bVar8 = pSrc[8];
    bVar9 = pSrc[9];
    bVar10 = pSrc[10];
    bVar11 = pSrc[0xb];
    bVar12 = pSrc[0xc];
    bVar13 = pSrc[0xd];
    bVar14 = pSrc[0xe];
    pDst[uVar21] = (uint)(bVar1 >> 1) | (uint)*pSrc << 7;
    pDst[uVar21 + 1] = (uint)(bVar3 >> 2) | (uint)bVar2 << 6 | (bVar1 & 1) << 0xe;
    pDst[uVar21 + 2] = (uint)(bVar5 >> 3) | (uint)bVar4 << 5 | (bVar3 & 3) << 0xd;
    pDst[uVar21 + 3] = (uint)(bVar7 >> 4) | (uint)bVar6 << 4 | (bVar5 & 7) << 0xc;
    pDst[uVar21 + 4] = (uint)(bVar9 >> 5) | (bVar7 & 0xf) * 0x800 + (uint)bVar8 * 8;
    pDst[uVar21 + 5] = (uint)(bVar11 >> 6) | (bVar9 & 0x1f) * 0x400 + (uint)bVar10 * 4;
    pDst[uVar21 + 6] = (uint)(bVar13 >> 7) | (bVar11 & 0x3f) * 0x200 + (uint)bVar12 * 2;
    pDst[uVar21 + 7] = (bVar13 & 0x7f) << 8 | (uint)bVar14;
    pSrc = pSrc + 0xf;
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar21] = (uint)(bVar1 >> 1) | (uint)*pSrc << 7;
    uVar20 = (uint)(length & 7);
    if (uVar20 != 1) {
      pbVar22 = pSrc + 2;
      uVar17 = 0;
      iVar15 = 1;
      iVar19 = 0xf;
      while( true ) {
        uVar16 = (uint)bVar1;
        iVar18 = iVar19 - iVar15;
        if (iVar18 == 0 || iVar19 < iVar15) break;
        uVar17 = (uVar17 | uVar16 & ~(-1 << (sbyte)iVar15)) << ((byte)iVar18 & 0x1f);
        bVar1 = *pbVar22;
        pbVar22 = pbVar22 + 1;
        iVar15 = 8;
        iVar19 = iVar18;
      }
      iVar15 = iVar15 - iVar19;
      pDst[uVar21 + 1] =
           ~(-1 << ((byte)iVar19 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar15 & 0x1f)) | uVar17;
      if (2 < uVar20) {
        uVar17 = 0;
        iVar18 = 0xf;
        iVar19 = 0xf;
        if (iVar15 != 0) goto LAB_001103e1;
        while( true ) {
          iVar18 = iVar19;
          uVar16 = (uint)*pbVar22;
          pbVar22 = pbVar22 + 1;
          iVar15 = 8;
LAB_001103e1:
          iVar19 = iVar18 - iVar15;
          if (iVar19 == 0 || iVar18 < iVar15) break;
          uVar17 = (uVar17 | uVar16 & ~(-1 << ((byte)iVar15 & 0x1f))) << ((byte)iVar19 & 0x1f);
        }
        iVar15 = iVar15 - iVar18;
        pDst[uVar21 + 2] = ~(-1 << ((byte)iVar18 & 0x1f)) & uVar16 >> ((byte)iVar15 & 0x1f) | uVar17
        ;
        if (uVar20 != 3) {
          uVar17 = 0;
          iVar18 = 0xf;
          iVar19 = 0xf;
          if (iVar15 != 0) goto LAB_00110441;
          while( true ) {
            iVar18 = iVar19;
            uVar16 = (uint)*pbVar22;
            pbVar22 = pbVar22 + 1;
            iVar15 = 8;
LAB_00110441:
            iVar19 = iVar18 - iVar15;
            if (iVar19 == 0 || iVar18 < iVar15) break;
            uVar17 = (uVar17 | uVar16 & ~(-1 << ((byte)iVar15 & 0x1f))) << ((byte)iVar19 & 0x1f);
          }
          iVar15 = iVar15 - iVar18;
          pDst[uVar21 + 3] =
               ~(-1 << ((byte)iVar18 & 0x1f)) & uVar16 >> ((byte)iVar15 & 0x1f) | uVar17;
          if (4 < uVar20) {
            uVar17 = 0;
            iVar18 = 0xf;
            iVar19 = 0xf;
            if (iVar15 != 0) goto LAB_001104a1;
            while( true ) {
              iVar18 = iVar19;
              uVar16 = (uint)*pbVar22;
              pbVar22 = pbVar22 + 1;
              iVar15 = 8;
LAB_001104a1:
              iVar19 = iVar18 - iVar15;
              if (iVar19 == 0 || iVar18 < iVar15) break;
              uVar17 = (uVar17 | uVar16 & ~(-1 << ((byte)iVar15 & 0x1f))) << ((byte)iVar19 & 0x1f);
            }
            iVar15 = iVar15 - iVar18;
            pDst[uVar21 + 4] =
                 ~(-1 << ((byte)iVar18 & 0x1f)) & uVar16 >> ((byte)iVar15 & 0x1f) | uVar17;
            if (uVar20 != 5) {
              uVar17 = 0;
              iVar18 = 0xf;
              iVar19 = 0xf;
              if (iVar15 != 0) goto LAB_00110501;
              while( true ) {
                iVar18 = iVar19;
                uVar16 = (uint)*pbVar22;
                pbVar22 = pbVar22 + 1;
                iVar15 = 8;
LAB_00110501:
                iVar19 = iVar18 - iVar15;
                if (iVar19 == 0 || iVar18 < iVar15) break;
                uVar17 = (uVar17 | uVar16 & ~(-1 << ((byte)iVar15 & 0x1f))) << ((byte)iVar19 & 0x1f)
                ;
              }
              iVar15 = iVar15 - iVar18;
              pDst[uVar21 + 5] =
                   ~(-1 << ((byte)iVar18 & 0x1f)) & uVar16 >> ((byte)iVar15 & 0x1f) | uVar17;
              if (uVar20 == 7) {
                uVar20 = 0;
                iVar18 = 0xf;
                iVar19 = 0xf;
                if (iVar15 != 0) goto LAB_0011055d;
                while( true ) {
                  iVar18 = iVar19;
                  uVar16 = (uint)*pbVar22;
                  pbVar22 = pbVar22 + 1;
                  iVar15 = 8;
LAB_0011055d:
                  iVar19 = iVar18 - iVar15;
                  if (iVar19 == 0 || iVar18 < iVar15) break;
                  uVar20 = (uVar20 | uVar16 & ~(-1 << ((byte)iVar15 & 0x1f))) <<
                           ((byte)iVar19 & 0x1f);
                }
                pDst[uVar21 + 6] =
                     ~(-1 << ((byte)iVar18 & 0x1f)) & uVar16 >> ((byte)iVar15 - (byte)iVar18 & 0x1f)
                     | uVar20;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_15uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		OPJ_UINT32 val7 = *pSrc++;
		OPJ_UINT32 val8 = *pSrc++;
		OPJ_UINT32 val9 = *pSrc++;
		OPJ_UINT32 val10 = *pSrc++;
		OPJ_UINT32 val11 = *pSrc++;
		OPJ_UINT32 val12 = *pSrc++;
		OPJ_UINT32 val13 = *pSrc++;
		OPJ_UINT32 val14 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 7) | (val1 >> 1));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x1U) << 14) | (val2 << 6) | (val3 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val3 & 0x3U) << 13) | (val4 << 5) | (val5 >> 3));
		pDst[i+3] = (OPJ_INT32)(((val5 & 0x7U) << 12) | (val6 << 4) | (val7 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val7 & 0xFU) << 11) | (val8 << 3) | (val9 >> 5));
		pDst[i+5] = (OPJ_INT32)(((val9 & 0x1FU) << 10) | (val10 << 2) | (val11 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val11 & 0x3FU) << 9) | (val12 << 1) | (val13 >> 7));
		pDst[i+7] = (OPJ_INT32)(((val13 & 0x7FU) << 8) | (val14));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 15)

		if (length > 1U) {
			GETBITS(pDst[i+1], 15)
			if (length > 2U) {
				GETBITS(pDst[i+2], 15)
				if (length > 3U) {
					GETBITS(pDst[i+3], 15)
					if (length > 4U) {
						GETBITS(pDst[i+4], 15)
						if (length > 5U) {
							GETBITS(pDst[i+5], 15)
							if (length > 6U) {
								GETBITS(pDst[i+6], 15)
							}
						}
					}
				}
			}
		}
	}
}